

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslOpMap.cpp
# Opt level: O1

TOperator glslang::HlslOpMap::postUnary(EHlslTokenClass op)

{
  if ((int)op < 0x165) {
    if (op == EHTokIncOp) {
      return EOpPostIncrement;
    }
    if (op == EHTokDecOp) {
      return EOpPostDecrement;
    }
  }
  else {
    if (op == EHTokColonColon) {
      return EOpScoping;
    }
    if (op == EHTokDot) {
      return EOpIndexDirectStruct;
    }
    if (op == EHTokLeftBracket) {
      return EOpIndexIndirect;
    }
  }
  return EOpNull;
}

Assistant:

TOperator HlslOpMap::postUnary(EHlslTokenClass op)
{
    switch (op) {
    case EHTokDot:         return EOpIndexDirectStruct;
    case EHTokLeftBracket: return EOpIndexIndirect;

    case EHTokIncOp:       return EOpPostIncrement;
    case EHTokDecOp:       return EOpPostDecrement;

    case EHTokColonColon:  return EOpScoping;

    default:               return EOpNull;             // means not a post-unary op
    }
}